

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PaddingLayerParams_PaddingReflection * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_reflection(PaddingLayerParams *this)

{
  bool bVar1;
  PaddingLayerParams_PaddingReflection *this_00;
  PaddingLayerParams *this_local;
  
  bVar1 = has_reflection(this);
  if (!bVar1) {
    clear_PaddingType(this);
    set_has_reflection(this);
    this_00 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
    PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(this_00);
    (this->PaddingType_).reflection_ = this_00;
  }
  return (PaddingLayerParams_PaddingReflection *)(this->PaddingType_).constant_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingReflection* PaddingLayerParams::mutable_reflection() {
  if (!has_reflection()) {
    clear_PaddingType();
    set_has_reflection();
    PaddingType_.reflection_ = new ::CoreML::Specification::PaddingLayerParams_PaddingReflection;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.reflection)
  return PaddingType_.reflection_;
}